

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * CompileVmBreak(ExpressionContext *ctx,VmModule *module,ExprBreak *node)

{
  uint uVar1;
  Allocator *pAVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  VmValue *pVVar5;
  
  if (node->closures != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->closures);
  }
  uVar1 = (module->loopInfo).count;
  uVar3 = uVar1 - *(int *)&(node->super_ExprBase).field_0x2c;
  if (uVar3 < uVar1) {
    anon_unknown.dwarf_107107::CreateJump
              (module,(node->super_ExprBase).source,
               &((module->loopInfo).data[uVar3].breakBlock)->super_VmValue);
    iVar4 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x98);
    pVVar5 = (VmValue *)CONCAT44(extraout_var,iVar4);
    pAVar2 = module->allocator;
    pVVar5->typeID = 0;
    pVVar5->source = (SynBase *)0x0;
    (pVVar5->comment).begin = (char *)0x0;
    (pVVar5->type).type = VM_TYPE_VOID;
    (pVVar5->type).size = 0;
    (pVVar5->type).structType = (TypeBase *)0x0;
    (pVVar5->comment).end = (char *)0x0;
    (pVVar5->users).allocator = pAVar2;
    (pVVar5->users).data = (pVVar5->users).little;
    (pVVar5->users).count = 0;
    (pVVar5->users).max = 8;
    pVVar5->hasKnownNonSimpleUse = false;
    pVVar5->hasSideEffects = false;
    pVVar5->hasMemoryAccess = false;
    pVVar5->canBeRemoved = true;
    pVVar5->hasKnownSimpleUse = false;
    pVVar5->_vptr_VmValue = (_func_int **)&PTR__VmValue_00224c70;
    pVVar5 = anon_unknown.dwarf_107107::CheckType
                       (ctx,(ExprBase *)(node->super_ExprBase).type,pVVar5);
    return pVVar5;
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x199,
                "T &SmallArray<VmModule::LoopInfo, 32>::operator[](unsigned int) [T = VmModule::LoopInfo, N = 32]"
               );
}

Assistant:

VmValue* CompileVmBreak(ExpressionContext &ctx, VmModule *module, ExprBreak *node)
{
	if(node->closures)
		CompileVm(ctx, module, node->closures);

	VmBlock *target = module->loopInfo[module->loopInfo.size() - node->depth].breakBlock;

	CreateJump(module, node->source, target);

	return CheckType(ctx, node, CreateVoid(module));
}